

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O1

void dump_info(PlayerBase *player)

{
  UINT32 UVar1;
  DEV_DEF *pDVar2;
  FILE *__stream;
  int iVar3;
  undefined4 extraout_var;
  DEV_DEF **ppDVar4;
  ulong uVar5;
  ulong uVar6;
  char str [5];
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> devInfList;
  PLR_SONG_INFO songInfo;
  
  __stream = _stderr;
  devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*player->_vptr_PlayerBase[3])();
  fprintf(__stream,"PlayerName: %s\n",CONCAT44(extraout_var,iVar3));
  (*player->_vptr_PlayerBase[8])(player,&songInfo);
  (*player->_vptr_PlayerBase[9])(player,&devInfList);
  str[4] = '\0';
  str[0] = (char)(songInfo.format >> 0x18);
  str[1] = (char)(songInfo.format >> 0x10);
  str[2] = (char)(songInfo.format >> 8);
  str[3] = (char)songInfo.format;
  fprintf(_stderr,"SongInfo: %s v%X.%X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",str,
          (ulong)songInfo.fileVerMaj,(ulong)songInfo.fileVerMin,(ulong)songInfo.tickRateMul,
          (ulong)songInfo.tickRateDiv,(ulong)songInfo.songLen,(ulong)songInfo.loopTick,
          (ulong)songInfo.deviceCnt);
  if (devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      UVar1 = devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6].core;
      str[4] = '\0';
      str[0] = (char)(UVar1 >> 0x18);
      str[1] = (char)(UVar1 >> 0x10);
      str[2] = (char)(UVar1 >> 8);
      str[3] = (char)UVar1;
      fprintf(_stderr,"  Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
              (ulong)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].id,
              (ulong)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].type,
              (ulong)(uint)(int)(char)devInfList.
                                      super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar6].instance,str,
              (ulong)(devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar6].devCfg)->clock,
              (ulong)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].smplRate,
              (ulong)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].volume);
      ppDVar4 = SndEmu_GetDevDefList
                          (devInfList.
                           super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar6].type);
      fwrite("    Cores:",10,1,_stderr);
      pDVar2 = *ppDVar4;
      while (pDVar2 != (DEV_DEF *)0x0) {
        ppDVar4 = ppDVar4 + 1;
        UVar1 = pDVar2->coreID;
        str[4] = '\0';
        str[0] = (char)(UVar1 >> 0x18);
        str[1] = (char)(UVar1 >> 0x10);
        str[2] = (char)(UVar1 >> 8);
        str[3] = (char)UVar1;
        fprintf(_stderr," %s",str);
        pDVar2 = *ppDVar4;
      }
      fputc(10,_stderr);
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar5 = ((long)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  fputc(10,_stderr);
  if (devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)devInfList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void dump_info(PlayerBase *player) {
    std::vector<PLR_DEV_INFO> devInfList;
    PLR_SONG_INFO songInfo;
    const DEV_DEF **devDefList;
    UINT32 i;
    char str[5];

    fprintf(stderr,"PlayerName: %s\n",player->GetPlayerName());
    player->GetSongInfo(songInfo);
    player->GetSongDeviceInfo(devInfList);

    FCC2STR(str,songInfo.format);
    fprintf(stderr,"SongInfo: %s v%X.%X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
      str,
      songInfo.fileVerMaj,
      songInfo.fileVerMin,
      songInfo.tickRateMul,
      songInfo.tickRateDiv,
      songInfo.songLen,
      songInfo.loopTick,
      songInfo.deviceCnt);

    for(i=0;i<devInfList.size();i++) {
        FCC2STR(str,devInfList[i].core);
        fprintf(stderr,"  Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
          devInfList[i].id,
          devInfList[i].type,
          (INT8)devInfList[i].instance,
          str,
          devInfList[i].devCfg->clock,
          devInfList[i].smplRate,
          devInfList[i].volume);
        devDefList = SndEmu_GetDevDefList(devInfList[i].type);
        fprintf(stderr,"    Cores:");
        while(*devDefList) {
            FCC2STR(str,(*devDefList)->coreID);
            fprintf(stderr," %s",str);
            devDefList++;
        }
        fprintf(stderr,"\n");

    }
    fprintf(stderr,"\n");
}